

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MultiFab::norm1(MultiFab *this,Vector<int,_std::allocator<int>_> *comps,int ngrow,bool local)

{
  bool bVar1;
  Long LVar2;
  double *v;
  undefined8 in_RDX;
  Vector<double,_std::allocator<double>_> *in_RDI;
  byte in_R8B;
  int comp;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<int,_std::allocator<int>_> *__range1;
  int n;
  Vector<double,_std::allocator<double>_> *nm1;
  bool in_stack_000000cf;
  int in_stack_000000d0;
  int in_stack_000000d4;
  MultiFab *in_stack_000000d8;
  MPI_Comm in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  Vector<double,_std::allocator<double>_> *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  undefined8 local_40;
  undefined1 local_25;
  undefined4 local_24;
  byte local_1d;
  undefined8 local_18;
  
  local_1d = in_R8B & 1;
  __n = in_RDI;
  local_18 = in_RDX;
  LVar2 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xfec723);
  local_24 = (undefined4)LVar2;
  local_25 = 0;
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0xfec736);
  std::vector<double,_std::allocator<double>_>::reserve(in_stack_ffffffffffffffa0,(size_type)__n);
  local_40 = local_18;
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), bVar1
        ) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_48);
    norm1(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cf);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
              );
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  if ((local_1d & 1) == 0) {
    v = Vector<double,_std::allocator<double>_>::dataPtr
                  ((Vector<double,_std::allocator<double>_> *)0xfec80c);
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>(v,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

Vector<Real>
MultiFab::norm1 (const Vector<int>& comps, int ngrow, bool local) const
{
    BL_ASSERT(ixType().cellCentered());

    int n = comps.size();
    Vector<Real> nm1;
    nm1.reserve(n);

    for (int comp : comps) {
        nm1.push_back(this->norm1(comp, ngrow, true));
    }

    if (!local)
        ParallelAllReduce::Sum(nm1.dataPtr(), n, ParallelContext::CommunicatorSub());

    return nm1;
}